

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * google::protobuf::internal::NameOfDenseEnumSlow_abi_cxx11_(int v,DenseEnumCacheInfo *deci)

{
  string *psVar1;
  EnumDescriptor *desc;
  string **ppsVar2;
  string **ppsVar3;
  bool bVar4;
  
  psVar1 = (string *)&fixed_address_empty_string;
  if ((deci->min_val <= v) && (v <= deci->max_val)) {
    desc = (*deci->descriptor_fn)();
    ppsVar2 = MakeDenseEnumCache_abi_cxx11_(desc,deci->min_val,deci->max_val);
    LOCK();
    ppsVar3 = (deci->cache)._M_b._M_p;
    bVar4 = ppsVar3 == (string **)0x0;
    if (bVar4) {
      (deci->cache)._M_b._M_p = ppsVar2;
      ppsVar3 = (string **)0x0;
    }
    UNLOCK();
    if (!bVar4) {
      operator_delete__(ppsVar2);
      ppsVar2 = ppsVar3;
    }
    psVar1 = ppsVar2[(long)v - (long)deci->min_val];
  }
  return psVar1;
}

Assistant:

PROTOBUF_NOINLINE const std::string& NameOfDenseEnumSlow(
    int v, DenseEnumCacheInfo* deci) {
  if (v < deci->min_val || v > deci->max_val)
    return GetEmptyStringAlreadyInited();

  const std::string** new_cache =
      MakeDenseEnumCache(deci->descriptor_fn(), deci->min_val, deci->max_val);
  const std::string** old_cache = nullptr;

  if (deci->cache.compare_exchange_strong(old_cache, new_cache,
                                          std::memory_order_release,
                                          std::memory_order_acquire)) {
    // We successfully stored our new cache, and the old value was nullptr.
    return *new_cache[v - deci->min_val];
  } else {
    // In the time it took to create our enum cache, another thread also
    //  created one, and put it into deci->cache.  So delete ours, and
    // use theirs instead.
    delete[] new_cache;
    return *old_cache[v - deci->min_val];
  }
}